

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

int Abc_NtkMiterIsConstant(Abc_Ntk_t *pMiter)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_2c;
  int i;
  Abc_Obj_t *pChild;
  Abc_Obj_t *pNodePo;
  Abc_Ntk_t *pMiter_local;
  
  iVar1 = Abc_NtkIsStrash(pMiter);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pMiter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x2ae,"int Abc_NtkMiterIsConstant(Abc_Ntk_t *)");
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_NtkPoNum(pMiter);
    if (iVar1 <= local_2c) {
      return 1;
    }
    pAVar2 = Abc_NtkPo(pMiter,local_2c);
    pAVar2 = Abc_ObjChild0(pAVar2);
    iVar1 = Abc_AigNodeIsConst(pAVar2);
    if (iVar1 == 0) {
      return -1;
    }
    pAVar3 = Abc_ObjRegular(pAVar2);
    pAVar4 = Abc_AigConst1(pMiter);
    if (pAVar3 != pAVar4) {
      __assert_fail("Abc_ObjRegular(pChild) == Abc_AigConst1(pMiter)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                    ,0x2b5,"int Abc_NtkMiterIsConstant(Abc_Ntk_t *)");
    }
    iVar1 = Abc_ObjIsComplement(pAVar2);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkMiterIsConstant( Abc_Ntk_t * pMiter )
{
    Abc_Obj_t * pNodePo, * pChild;
    int i;
    assert( Abc_NtkIsStrash(pMiter) );
    Abc_NtkForEachPo( pMiter, pNodePo, i )
    {
        pChild = Abc_ObjChild0( pNodePo );
        // check if the output is constant 1
        if ( Abc_AigNodeIsConst(pChild) )
        {
            assert( Abc_ObjRegular(pChild) == Abc_AigConst1(pMiter) );
            if ( !Abc_ObjIsComplement(pChild) )
            {
                // if the miter is constant 1, return immediately
//                printf( "MITER IS CONSTANT 1!\n" );
                return 0;
            }
        }
/*
        // check if the output is not constant 0
        else if ( Abc_ObjRegular(pChild)->fPhase != (unsigned)Abc_ObjIsComplement(pChild) )
        {
            return 0;
        }
*/
        // if the miter is undecided (or satisfiable), return immediately
        else 
            return -1;
    }
    // return 1, meaning all outputs are constant zero
    return 1;
}